

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_initCStream_internal
                 (ZSTDMT_CCtx *mtctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ldmState_t *ldmState;
  void *pvVar1;
  pthread_mutex_t *ppVar2;
  ZSTD_freeFunction p_Var3;
  ZSTD_allocFunction p_Var4;
  ZSTD_customMem ZVar5;
  undefined4 uVar6;
  U32 UVar7;
  undefined4 in_EAX;
  int iVar8;
  U32 UVar9;
  ZSTDMT_jobDescription *pZVar10;
  ZSTDMT_bufferPool *pZVar11;
  ZSTDMT_CCtxPool *pool;
  ZSTD_CDict *pZVar12;
  ulong uVar13;
  BYTE *pBVar14;
  size_t __size;
  ldmEntry_t *plVar15;
  byte bVar16;
  long lVar17;
  size_t __size_00;
  ZSTD_format_e ZVar18;
  uint uVar19;
  size_t unaff_R13;
  U32 UVar20;
  ulong uVar21;
  size_t __size_01;
  BYTE *pBVar22;
  int maxNbBuffers;
  long lVar23;
  bool bVar24;
  uint uVar25;
  uint uVar27;
  uint uVar28;
  undefined1 in_XMM0 [16];
  undefined1 auVar26 [16];
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  undefined1 local_108 [96];
  ldmParams_t local_a8 [2];
  ZSTD_allocFunction local_70;
  ZSTD_freeFunction p_Stack_68;
  void *local_60;
  
  uVar19 = params.cParams.windowLog;
  maxNbBuffers = params.nbWorkers;
  auVar26 = pmovsxbd(in_XMM0,0xe1e1e1e0);
  uVar25 = auVar26._0_4_ + params.cParams.windowLog;
  uVar27 = auVar26._4_4_ + params.cParams.chainLog;
  uVar28 = auVar26._8_4_ + params.cParams.hashLog;
  uVar29 = auVar26._12_4_ + params.cParams.searchLog;
  auVar26 = pmovsxbd(params.cParams._0_16_,0xe1e6e6e9);
  uVar30 = auVar26._0_4_;
  uVar31 = auVar26._4_4_;
  uVar32 = auVar26._8_4_;
  uVar33 = auVar26._12_4_;
  auVar26._0_4_ = -(uint)(((uVar25 < uVar30) * uVar25 | (uVar25 >= uVar30) * uVar30) == uVar25);
  auVar26._4_4_ = -(uint)(((uVar27 < uVar31) * uVar27 | (uVar27 >= uVar31) * uVar31) == uVar27);
  auVar26._8_4_ = -(uint)(((uVar28 < uVar32) * uVar28 | (uVar28 >= uVar32) * uVar32) == uVar28);
  auVar26._12_4_ = -(uint)(((uVar29 < uVar33) * uVar29 | (uVar29 >= uVar33) * uVar33) == uVar29);
  iVar8 = movmskps(in_EAX,auVar26);
  if ((((iVar8 != 0) || (4 < params.cParams.minMatch - 3)) ||
      (0x20000 < params.cParams.targetLength)) || (8 < params.cParams.strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b3,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b4,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if (params.nbWorkers != (mtctx->params).nbWorkers) {
    iVar8 = POOL_resize(mtctx->factory,(ulong)(uint)params.nbWorkers);
    if (iVar8 == 0) {
      local_108._0_4_ = maxNbBuffers + 2;
      ZVar18 = mtctx->jobIDMask + ZSTD_f_zstd1_magicless;
      bVar24 = true;
      if (ZVar18 < (uint)local_108._0_4_) {
        ZSTDMT_freeJobsTable(mtctx->jobs,ZVar18,mtctx->cMem);
        mtctx->jobIDMask = 0;
        pZVar10 = ZSTDMT_createJobsTable((U32 *)local_108,mtctx->cMem);
        mtctx->jobs = pZVar10;
        if (pZVar10 == (ZSTDMT_jobDescription *)0x0) {
          unaff_R13 = 0xffffffffffffffc0;
          bVar24 = false;
        }
        else {
          ZVar18 = local_108._0_4_ - ZSTD_f_zstd1_magicless;
          if ((local_108._0_4_ ^ ZVar18) <= ZVar18) {
            __assert_fail("(nbJobs != 0) && ((nbJobs & (nbJobs - 1)) == 0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8870,"size_t ZSTDMT_expandJobsTable(ZSTDMT_CCtx *, U32)");
          }
          mtctx->jobIDMask = ZVar18;
          unaff_R13 = 0;
          bVar24 = true;
        }
      }
      else {
        unaff_R13 = 0;
      }
      if (bVar24) {
        pZVar11 = ZSTDMT_expandBufferPool(mtctx->bufPool,maxNbBuffers * 2 + 3);
        mtctx->bufPool = pZVar11;
        if (pZVar11 != (ZSTDMT_bufferPool *)0x0) {
          pool = mtctx->cctxPool;
          if (pool == (ZSTDMT_CCtxPool *)0x0) {
            pool = (ZSTDMT_CCtxPool *)0x0;
          }
          else if (pool->totalCCtx < maxNbBuffers) {
            pvVar1 = (pool->cMem).opaque;
            local_108._16_4_ = SUB84(pvVar1,0);
            local_108._20_4_ = (undefined4)((ulong)pvVar1 >> 0x20);
            p_Var4 = (pool->cMem).customAlloc;
            p_Var3 = (pool->cMem).customFree;
            local_108._0_4_ = SUB84(p_Var4,0);
            local_108._4_4_ = (undefined4)((ulong)p_Var4 >> 0x20);
            local_108._8_4_ = SUB84(p_Var3,0);
            local_108._12_4_ = (undefined4)((ulong)p_Var3 >> 0x20);
            ZSTDMT_freeCCtxPool(pool);
            ZVar5.opaque._4_4_ = local_108._20_4_;
            ZVar5.opaque._0_4_ = local_108._16_4_;
            ZVar5.customAlloc._4_4_ = local_108._4_4_;
            ZVar5.customAlloc._0_4_ = local_108._0_4_;
            ZVar5.customFree._4_4_ = local_108._12_4_;
            ZVar5.customFree._0_4_ = local_108._8_4_;
            pool = ZSTDMT_createCCtxPool(maxNbBuffers,ZVar5);
          }
          mtctx->cctxPool = pool;
          if (pool != (ZSTDMT_CCtxPool *)0x0) {
            pZVar11 = ZSTDMT_expandBufferPool(mtctx->seqPool,maxNbBuffers);
            mtctx->seqPool = pZVar11;
            unaff_R13 = 0xffffffffffffffc0;
            if (pZVar11 != (ZSTDMT_bufferPool *)0x0) {
              unaff_R13 = 0;
              if (maxNbBuffers < 1) {
                maxNbBuffers = 0;
              }
              if (0xff < maxNbBuffers) {
                maxNbBuffers = 0x100;
              }
              (mtctx->params).nbWorkers = maxNbBuffers;
            }
            goto LAB_00190aec;
          }
        }
        goto LAB_00190980;
      }
    }
    else {
LAB_00190980:
      unaff_R13 = 0xffffffffffffffc0;
    }
LAB_00190aec:
    if (0xffffffffffffff88 < unaff_R13) {
      return unaff_R13;
    }
  }
  if (params.jobSize - 1 < 0x7ffff) {
    params.jobSize = 0x80000;
  }
  if (0x40000000 < params.jobSize) {
    params.jobSize = 0x40000000;
  }
  if (mtctx->allJobsCompleted == 0) {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
    mtctx->allJobsCompleted = 1;
  }
  memcpy(&mtctx->params,&params,0xd0);
  mtctx->frameContentSize = pledgedSrcSize;
  ZSTD_freeCDict(mtctx->cdictLocal);
  if (dict == (void *)0x0) {
    mtctx->cdictLocal = (ZSTD_CDict *)0x0;
    mtctx->cdict = cdict;
  }
  else {
    ZVar5 = mtctx->cMem;
    memset((ZSTD_CCtx_params *)local_108,0,0xd0);
    local_108._32_4_ = 1;
    local_108._28_4_ = params.cParams.strategy;
    local_108._24_4_ = params.cParams.targetLength;
    local_108._4_4_ = params.cParams.windowLog;
    local_108._8_4_ = params.cParams.chainLog;
    local_108._12_4_ = params.cParams.hashLog;
    local_108._16_4_ = params.cParams.searchLog;
    local_108._20_4_ = params.cParams.minMatch;
    local_70 = (mtctx->cMem).customAlloc;
    p_Stack_68 = (mtctx->cMem).customFree;
    local_60 = (mtctx->cMem).opaque;
    pZVar12 = ZSTD_createCDict_advanced2
                        (dict,dictSize,ZSTD_dlm_byCopy,dictContentType,(ZSTD_CCtx_params *)local_108
                         ,ZVar5);
    mtctx->cdictLocal = pZVar12;
    mtctx->cdict = pZVar12;
    if (pZVar12 == (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  if (9 < (uint)params.overlapLog) {
    __assert_fail("0 <= ovlog && ovlog <= 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x898d,"int ZSTDMT_overlapLog(int, ZSTD_strategy)");
  }
  uVar25 = params.overlapLog;
  if (params.overlapLog == 0) {
    uVar25 = 6;
    if (params.cParams.strategy - ZSTD_lazy2 < 5) {
      uVar25 = *(uint *)(&DAT_003036b0 + (ulong)(params.cParams.strategy - ZSTD_lazy2) * 4);
    }
  }
  uVar27 = uVar19 - (9 - uVar25);
  if (uVar25 < 2) {
    uVar27 = 0;
  }
  if (params.ldmParams.enableLdm == ZSTD_ps_enable) {
    uVar28 = (params.cParams.strategy < ZSTD_btlazy2) + 2 + params.cParams.chainLog;
    uVar27 = 0x15;
    if (0x15 < uVar28) {
      uVar27 = uVar28;
    }
    uVar28 = 0x1e;
    if (uVar27 < 0x1e) {
      uVar28 = uVar27;
    }
    uVar27 = uVar28 - 2;
    if (uVar19 < uVar28 - 2) {
      uVar27 = uVar19;
    }
    uVar27 = uVar27 - (9 - uVar25);
  }
  if (0x1f < uVar27) {
    __assert_fail("0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x899f,"size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params *)");
  }
  uVar13 = 0;
  if (uVar27 != 0) {
    uVar13 = 1L << ((byte)uVar27 & 0x3f);
  }
  mtctx->targetPrefixSize = uVar13;
  mtctx->targetSectionSize = params.jobSize;
  if (params.jobSize == 0) {
    if (params.ldmParams.enableLdm == ZSTD_ps_enable) {
      uVar25 = (params.cParams.strategy < ZSTD_btlazy2) + 2 + params.cParams.chainLog;
      uVar19 = 0x15;
      if (0x15 < uVar25) {
        uVar19 = uVar25;
      }
    }
    else {
      uVar25 = 0x12;
      if (0x12 < uVar19) {
        uVar25 = uVar19;
      }
      uVar19 = uVar25 + 2;
    }
    bVar16 = 0x1e;
    if (uVar19 < 0x1e) {
      bVar16 = (byte)uVar19;
    }
    mtctx->targetSectionSize = 1L << (bVar16 & 0x3f);
  }
  uVar21 = mtctx->targetSectionSize;
  if (0x40000000 < uVar21) {
    __assert_fail("mtctx->targetSectionSize <= (size_t)ZSTDMT_JOBSIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89da,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if (params.rsyncable != 0) {
    if (uVar21 < 0x400) {
      __assert_fail("jobSizeKB >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x89df,
                    "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                   );
    }
    uVar19 = 0x1f;
    uVar25 = (uint)(uVar21 >> 10);
    if (uVar25 != 0) {
      for (; uVar25 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    if (uVar19 < 9) {
      __assert_fail("rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x89e2,
                    "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                   );
    }
    (mtctx->rsync).hash = 0;
    (mtctx->rsync).hitMask = ~(-1L << (0x29 - ((byte)uVar19 ^ 0x1f) & 0x3f));
    (mtctx->rsync).primePower = 0xf5507fe35f91f8cb;
  }
  if (uVar21 < uVar13) {
    mtctx->targetSectionSize = uVar13;
  }
  ppVar2 = (pthread_mutex_t *)mtctx->bufPool;
  uVar13 = mtctx->targetSectionSize;
  if (uVar13 < 0xff00ff00ff00ff00) {
    uVar21 = 0;
    if (uVar13 < 0x20000) {
      uVar21 = -(uVar13 - 0x20000) >> 0xb;
    }
    lVar17 = (uVar13 >> 8) + uVar13 + uVar21;
  }
  else {
    lVar17 = 0;
  }
  lVar23 = -0x48;
  if (lVar17 != 0) {
    lVar23 = lVar17;
  }
  pthread_mutex_lock(ppVar2);
  ppVar2[1].__align = lVar23;
  pthread_mutex_unlock(ppVar2);
  if ((mtctx->params).ldmParams.enableLdm == ZSTD_ps_enable) {
    uVar13 = 1L << ((byte)(mtctx->params).cParams.windowLog & 0x3f);
  }
  else {
    uVar13 = 0;
  }
  uVar19 = (mtctx->params).nbWorkers;
  uVar21 = 1;
  if (1 < (int)uVar19) {
    uVar21 = (ulong)uVar19;
  }
  uVar21 = uVar21 * mtctx->targetSectionSize;
  if (uVar21 < uVar13) {
    uVar21 = uVar13;
  }
  __size_01 = uVar21 + (3 - (ulong)(mtctx->targetPrefixSize == 0)) * mtctx->targetSectionSize;
  bVar24 = true;
  if ((mtctx->roundBuff).capacity < __size_01) {
    pBVar14 = (mtctx->roundBuff).buffer;
    if (pBVar14 != (BYTE *)0x0) {
      p_Var3 = (mtctx->cMem).customFree;
      if (p_Var3 == (ZSTD_freeFunction)0x0) {
        free(pBVar14);
      }
      else {
        (*p_Var3)((mtctx->cMem).opaque,pBVar14);
      }
    }
    p_Var4 = (mtctx->cMem).customAlloc;
    if (p_Var4 == (ZSTD_allocFunction)0x0) {
      pBVar14 = (BYTE *)malloc(__size_01);
    }
    else {
      pBVar14 = (BYTE *)(*p_Var4)((mtctx->cMem).opaque,__size_01);
    }
    (mtctx->roundBuff).buffer = pBVar14;
    bVar24 = pBVar14 != (BYTE *)0x0;
    if (!bVar24) {
      unaff_R13 = 0xffffffffffffffc0;
      __size_01 = 0;
    }
    (mtctx->roundBuff).capacity = __size_01;
  }
  if (!bVar24) {
    return unaff_R13;
  }
  (mtctx->roundBuff).pos = 0;
  mtctx->doneJobID = 0;
  mtctx->nextJobID = 0;
  mtctx->frameEnded = 0;
  mtctx->allJobsCompleted = 0;
  mtctx->consumed = 0;
  mtctx->produced = 0;
  (mtctx->inBuff).prefix.start = (void *)0x0;
  (mtctx->inBuff).prefix.size = 0;
  (mtctx->inBuff).buffer.start = (void *)0x0;
  (mtctx->inBuff).buffer.capacity = 0;
  (mtctx->inBuff).filled = 0;
  ppVar2 = (pthread_mutex_t *)mtctx->seqPool;
  uVar13 = mtctx->targetSectionSize;
  memcpy(local_108,&params,0xd0);
  if (local_a8[0].enableLdm == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(local_a8,(ZSTD_compressionParameters *)(local_108 + 4));
    if (local_a8[0].hashLog < local_a8[0].bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x86c9,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t, ZSTD_dictContentType_e)"
                   );
    }
    if (0x1f < local_a8[0].hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x86ca,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t, ZSTD_dictContentType_e)"
                   );
    }
  }
  else {
    local_a8[0].enableLdm = ZSTD_ps_auto;
    local_a8[0].hashLog = 0;
    local_a8[0].bucketSizeLog = 0;
    local_a8[0].minMatchLength = 0;
    local_a8[0].hashRateLog = 0;
    local_a8[0].windowLog = 0;
  }
  pvVar1 = local_60;
  p_Var3 = p_Stack_68;
  p_Var4 = local_70;
  (mtctx->serial).nextJobID = 0;
  if (local_108._36_4_ != 0) {
    (mtctx->serial).xxhState.total_len = 0;
    (mtctx->serial).xxhState.v[0] = 0;
    (mtctx->serial).xxhState.v[1] = 0;
    (mtctx->serial).xxhState.v[2] = 0;
    *(undefined1 (*) [16])((mtctx->serial).xxhState.v + 3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((mtctx->serial).xxhState.mem64 + 3) = (undefined1  [16])0x0;
    (mtctx->serial).xxhState.mem64[1] = 0;
    (mtctx->serial).xxhState.mem64[2] = 0;
    (mtctx->serial).xxhState.reserved64 = 0;
    (mtctx->serial).xxhState.v[0] = 0x60ea27eeadc0b5d6;
    (mtctx->serial).xxhState.v[1] = 0xc2b2ae3d27d4eb4f;
    (mtctx->serial).xxhState.v[2] = 0;
    (mtctx->serial).xxhState.v[3] = 0x61c8864e7a143579;
  }
  if (local_a8[0].enableLdm != ZSTD_ps_enable) goto LAB_00191379;
  UVar7 = local_a8[0].hashLog;
  __size = 8L << ((byte)local_a8[0].hashLog & 0x3f);
  uVar19 = local_a8[0].hashLog - local_a8[0].bucketSizeLog;
  UVar20 = (mtctx->serial).params.ldmParams.hashLog;
  __size_00 = 1L << ((byte)uVar19 & 0x3f);
  UVar9 = (mtctx->serial).params.ldmParams.bucketSizeLog;
  uVar21 = (ulong)local_a8[0].minMatchLength;
  pthread_mutex_lock(ppVar2);
  ppVar2[1].__align = (uVar13 / uVar21) * 0xc;
  pthread_mutex_unlock(ppVar2);
  (mtctx->serial).ldmState.window.nextSrc = (BYTE *)0x0;
  (mtctx->serial).ldmState.window.base = (BYTE *)0x0;
  (mtctx->serial).ldmState.window.dictBase = (BYTE *)0x0;
  (mtctx->serial).ldmState.window.dictLimit = 0;
  (mtctx->serial).ldmState.window.lowLimit = 0;
  *(undefined8 *)&(mtctx->serial).ldmState.window.nbOverflowCorrections = 0;
  (mtctx->serial).ldmState.window.base = " ";
  (mtctx->serial).ldmState.window.dictBase = " ";
  (mtctx->serial).ldmState.window.dictLimit = 2;
  (mtctx->serial).ldmState.window.lowLimit = 2;
  (mtctx->serial).ldmState.window.nextSrc = (BYTE *)"BC7 709 Luma:            ";
  (mtctx->serial).ldmState.window.nbOverflowCorrections = 0;
  plVar15 = (mtctx->serial).ldmState.hashTable;
  if (plVar15 == (ldmEntry_t *)0x0) {
LAB_00191183:
    if (p_Var4 == (ZSTD_allocFunction)0x0) {
      plVar15 = (ldmEntry_t *)malloc(__size);
    }
    else {
      plVar15 = (ldmEntry_t *)(*p_Var4)(pvVar1,__size);
    }
    (mtctx->serial).ldmState.hashTable = plVar15;
  }
  else if ((mtctx->serial).params.ldmParams.hashLog < UVar7) {
    if (p_Var3 == (ZSTD_freeFunction)0x0) {
      free(plVar15);
    }
    else {
      (*p_Var3)(pvVar1,plVar15);
    }
    goto LAB_00191183;
  }
  pBVar14 = (mtctx->serial).ldmState.bucketOffsets;
  if ((pBVar14 == (BYTE *)0x0) || (UVar20 - UVar9 < uVar19)) {
    if (pBVar14 != (BYTE *)0x0) {
      if (p_Var3 == (ZSTD_freeFunction)0x0) {
        free(pBVar14);
      }
      else {
        (*p_Var3)(pvVar1,pBVar14);
      }
    }
    if (p_Var4 == (ZSTD_allocFunction)0x0) {
      pBVar14 = (BYTE *)malloc(__size_00);
    }
    else {
      pBVar14 = (BYTE *)(*p_Var4)(pvVar1,__size_00);
    }
    (mtctx->serial).ldmState.bucketOffsets = pBVar14;
  }
  plVar15 = (mtctx->serial).ldmState.hashTable;
  if (plVar15 == (ldmEntry_t *)0x0) {
    return 0xffffffffffffffc0;
  }
  if ((mtctx->serial).ldmState.bucketOffsets == (BYTE *)0x0) {
    return 0xffffffffffffffc0;
  }
  ldmState = &(mtctx->serial).ldmState;
  memset(plVar15,0,__size);
  memset((mtctx->serial).ldmState.bucketOffsets,0,__size_00);
  (mtctx->serial).ldmState.loadedDictEnd = 0;
  if (dictContentType == ZSTD_dct_rawContent && dictSize != 0) {
    pBVar14 = (mtctx->serial).ldmState.window.base;
    if (pBVar14 == (BYTE *)0x0) {
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d8,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if ((mtctx->serial).ldmState.window.dictBase == (BYTE *)0x0) {
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d9,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    pBVar22 = (ldmState->window).nextSrc;
    if (pBVar22 != (BYTE *)dict) {
      uVar21 = (long)pBVar22 - (long)pBVar14;
      UVar20 = (mtctx->serial).ldmState.window.dictLimit;
      (mtctx->serial).ldmState.window.lowLimit = UVar20;
      if (uVar21 >> 0x20 != 0) {
        __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x48e0,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
      }
      UVar9 = (U32)uVar21;
      (mtctx->serial).ldmState.window.dictLimit = UVar9;
      (mtctx->serial).ldmState.window.dictBase = pBVar14;
      (mtctx->serial).ldmState.window.base = (BYTE *)((long)dict - uVar21);
      if (UVar9 - UVar20 < 8) {
        (mtctx->serial).ldmState.window.lowLimit = UVar9;
      }
    }
    pBVar22 = (BYTE *)(dictSize + (long)dict);
    (mtctx->serial).ldmState.window.nextSrc = pBVar22;
    pBVar14 = (mtctx->serial).ldmState.window.dictBase;
    uVar19 = (mtctx->serial).ldmState.window.dictLimit;
    if (dict < pBVar14 + uVar19 && pBVar14 + (mtctx->serial).ldmState.window.lowLimit < pBVar22) {
      uVar25 = (uint)((long)pBVar22 - (long)pBVar14);
      if ((long)(ulong)uVar19 < (long)pBVar22 - (long)pBVar14) {
        uVar25 = uVar19;
      }
      (mtctx->serial).ldmState.window.lowLimit = uVar25;
    }
    ZSTD_ldm_fillHashTable(ldmState,(BYTE *)dict,pBVar22,local_a8);
    UVar20 = 0;
    if (local_108._48_4_ == 0) {
      UVar20 = (int)pBVar22 - *(int *)&(mtctx->serial).ldmState.window.base;
    }
    (mtctx->serial).ldmState.loadedDictEnd = UVar20;
  }
  uVar6 = *(undefined4 *)&(mtctx->serial).ldmState.window.field_0x24;
  (mtctx->serial).ldmWindow.nbOverflowCorrections =
       (mtctx->serial).ldmState.window.nbOverflowCorrections;
  *(undefined4 *)&(mtctx->serial).ldmWindow.field_0x24 = uVar6;
  pBVar14 = (ldmState->window).nextSrc;
  pBVar22 = (mtctx->serial).ldmState.window.base;
  UVar20 = (mtctx->serial).ldmState.window.dictLimit;
  UVar9 = (mtctx->serial).ldmState.window.lowLimit;
  (mtctx->serial).ldmWindow.dictBase = (mtctx->serial).ldmState.window.dictBase;
  (mtctx->serial).ldmWindow.dictLimit = UVar20;
  (mtctx->serial).ldmWindow.lowLimit = UVar9;
  (mtctx->serial).ldmWindow.nextSrc = pBVar14;
  (mtctx->serial).ldmWindow.base = pBVar22;
LAB_00191379:
  memcpy(&(mtctx->serial).params,local_108,0xd0);
  (mtctx->serial).params.jobSize = uVar13 & 0xffffffff;
  return 0;
}

Assistant:

size_t ZSTDMT_initCStream_internal(
        ZSTDMT_CCtx* mtctx,
        const void* dict, size_t dictSize, ZSTD_dictContentType_e dictContentType,
        const ZSTD_CDict* cdict, ZSTD_CCtx_params params,
        unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTDMT_initCStream_internal (pledgedSrcSize=%u, nbWorkers=%u, cctxPool=%u)",
                (U32)pledgedSrcSize, params.nbWorkers, mtctx->cctxPool->totalCCtx);

    /* params supposed partially fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    /* init */
    if (params.nbWorkers != mtctx->params.nbWorkers)
        FORWARD_IF_ERROR( ZSTDMT_resize(mtctx, params.nbWorkers) , "");

    if (params.jobSize != 0 && params.jobSize < ZSTDMT_JOBSIZE_MIN) params.jobSize = ZSTDMT_JOBSIZE_MIN;
    if (params.jobSize > (size_t)ZSTDMT_JOBSIZE_MAX) params.jobSize = (size_t)ZSTDMT_JOBSIZE_MAX;

    DEBUGLOG(4, "ZSTDMT_initCStream_internal: %u workers", params.nbWorkers);

    if (mtctx->allJobsCompleted == 0) {   /* previous compression not correctly finished */
        ZSTDMT_waitForAllJobsCompleted(mtctx);
        ZSTDMT_releaseAllJobResources(mtctx);
        mtctx->allJobsCompleted = 1;
    }

    mtctx->params = params;
    mtctx->frameContentSize = pledgedSrcSize;
    if (dict) {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                                    ZSTD_dlm_byCopy, dictContentType, /* note : a loadPrefix becomes an internal CDict */
                                                    params.cParams, mtctx->cMem);
        mtctx->cdict = mtctx->cdictLocal;
        if (mtctx->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = NULL;
        mtctx->cdict = cdict;
    }

    mtctx->targetPrefixSize = ZSTDMT_computeOverlapSize(&params);
    DEBUGLOG(4, "overlapLog=%i => %u KB", params.overlapLog, (U32)(mtctx->targetPrefixSize>>10));
    mtctx->targetSectionSize = params.jobSize;
    if (mtctx->targetSectionSize == 0) {
        mtctx->targetSectionSize = 1ULL << ZSTDMT_computeTargetJobLog(&params);
    }
    assert(mtctx->targetSectionSize <= (size_t)ZSTDMT_JOBSIZE_MAX);

    if (params.rsyncable) {
        /* Aim for the targetsectionSize as the average job size. */
        U32 const jobSizeKB = (U32)(mtctx->targetSectionSize >> 10);
        U32 const rsyncBits = (assert(jobSizeKB >= 1), ZSTD_highbit32(jobSizeKB) + 10);
        /* We refuse to create jobs < RSYNC_MIN_BLOCK_SIZE bytes, so make sure our
         * expected job size is at least 4x larger. */
        assert(rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2);
        DEBUGLOG(4, "rsyncLog = %u", rsyncBits);
        mtctx->rsync.hash = 0;
        mtctx->rsync.hitMask = (1ULL << rsyncBits) - 1;
        mtctx->rsync.primePower = ZSTD_rollingHash_primePower(RSYNC_LENGTH);
    }
    if (mtctx->targetSectionSize < mtctx->targetPrefixSize) mtctx->targetSectionSize = mtctx->targetPrefixSize;  /* job size must be >= overlap size */
    DEBUGLOG(4, "Job Size : %u KB (note : set to %u)", (U32)(mtctx->targetSectionSize>>10), (U32)params.jobSize);
    DEBUGLOG(4, "inBuff Size : %u KB", (U32)(mtctx->targetSectionSize>>10));
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(mtctx->targetSectionSize));
    {
        /* If ldm is enabled we need windowSize space. */
        size_t const windowSize = mtctx->params.ldmParams.enableLdm == ZSTD_ps_enable ? (1U << mtctx->params.cParams.windowLog) : 0;
        /* Two buffers of slack, plus extra space for the overlap
         * This is the minimum slack that LDM works with. One extra because
         * flush might waste up to targetSectionSize-1 bytes. Another extra
         * for the overlap (if > 0), then one to fill which doesn't overlap
         * with the LDM window.
         */
        size_t const nbSlackBuffers = 2 + (mtctx->targetPrefixSize > 0);
        size_t const slackSize = mtctx->targetSectionSize * nbSlackBuffers;
        /* Compute the total size, and always have enough slack */
        size_t const nbWorkers = MAX(mtctx->params.nbWorkers, 1);
        size_t const sectionsSize = mtctx->targetSectionSize * nbWorkers;
        size_t const capacity = MAX(windowSize, sectionsSize) + slackSize;
        if (mtctx->roundBuff.capacity < capacity) {
            if (mtctx->roundBuff.buffer)
                ZSTD_customFree(mtctx->roundBuff.buffer, mtctx->cMem);
            mtctx->roundBuff.buffer = (BYTE*)ZSTD_customMalloc(capacity, mtctx->cMem);
            if (mtctx->roundBuff.buffer == NULL) {
                mtctx->roundBuff.capacity = 0;
                return ERROR(memory_allocation);
            }
            mtctx->roundBuff.capacity = capacity;
        }
    }
    DEBUGLOG(4, "roundBuff capacity : %u KB", (U32)(mtctx->roundBuff.capacity>>10));
    mtctx->roundBuff.pos = 0;
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->inBuff.prefix = kNullRange;
    mtctx->doneJobID = 0;
    mtctx->nextJobID = 0;
    mtctx->frameEnded = 0;
    mtctx->allJobsCompleted = 0;
    mtctx->consumed = 0;
    mtctx->produced = 0;
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, mtctx->targetSectionSize,
                                 dict, dictSize, dictContentType))
        return ERROR(memory_allocation);
    return 0;
}